

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

int Potassco::xconvert(char *x,char *out,char **errPos,int param_4)

{
  char cVar1;
  bool bVar2;
  char **in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *local_10;
  int local_4;
  
  bVar2 = empty(in_RDI,in_RDX);
  if (bVar2) {
    local_4 = 0;
  }
  else {
    local_10 = in_RDI + 1;
    cVar1 = *in_RDI;
    *in_RSI = cVar1;
    if (cVar1 == '\\') {
      cVar1 = *local_10;
      if (cVar1 == 'n') {
        *in_RSI = '\n';
        local_10 = in_RDI + 2;
      }
      else if (cVar1 == 't') {
        *in_RSI = '\t';
        local_10 = in_RDI + 2;
      }
      else if (cVar1 == 'v') {
        *in_RSI = '\v';
        local_10 = in_RDI + 2;
      }
    }
    local_4 = parsed(1,local_10,in_RDX);
  }
  return local_4;
}

Assistant:

int xconvert(const char* x, char& out, const char** errPos, int) {
	if (empty(x, errPos))     { return 0; }
	if ((out = *x++) == '\\') {
		switch(*x) {
			case 't': out = '\t'; ++x; break;
			case 'n': out = '\n'; ++x; break;
			case 'v': out = '\v'; ++x; break;
			default: break;
		}
	}
	return parsed(1, x, errPos);
}